

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall el::Logger::log(Logger *this)

{
  double in_XMM0_Qa;
  
  log((Logger *)&this[-1].m_logBuilder,in_XMM0_Qa);
  return;
}

Assistant:

virtual inline void log(el::base::type::ostream_t& os) const {
    os << m_id.c_str();
  }